

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O2

psa_status_t
psa_key_derivation_setup_kdf(psa_key_derivation_operation_t *operation,psa_algorithm_t kdf_alg)

{
  uint uVar1;
  psa_status_t pVar2;
  uint uVar3;
  
  memset(&operation->ctx,0,0x208);
  uVar3 = kdf_alg & 0xffffff00;
  pVar2 = -0x86;
  if ((((uVar3 == 0x20000100) || (uVar3 == 0x20000300)) || (uVar3 == 0x20000200)) &&
     ((uVar1 = kdf_alg - 1, (byte)uVar1 < 0x13 && ((0x79f9fU >> (uVar1 & 0x1f) & 1) != 0)))) {
    if (((uVar3 != 0x20000200) && (uVar3 != 0x20000300)) || ((kdf_alg & 0xff) - 9 < 2)) {
      operation->capacity = *(size_t *)(&DAT_00139c28 + (ulong)(uVar1 & 0xff) * 8);
      pVar2 = 0;
    }
  }
  return pVar2;
}

Assistant:

static psa_status_t psa_key_derivation_setup_kdf(
    psa_key_derivation_operation_t *operation,
    psa_algorithm_t kdf_alg )
{
    /* Make sure that operation->ctx is properly zero-initialised. (Macro
     * initialisers for this union leave some bytes unspecified.) */
    memset( &operation->ctx, 0, sizeof( operation->ctx ) );

    /* Make sure that kdf_alg is a supported key derivation algorithm. */
#if defined(MBEDTLS_MD_C)
    if( PSA_ALG_IS_HKDF( kdf_alg ) ||
        PSA_ALG_IS_TLS12_PRF( kdf_alg ) ||
        PSA_ALG_IS_TLS12_PSK_TO_MS( kdf_alg ) )
    {
        psa_algorithm_t hash_alg = PSA_ALG_HKDF_GET_HASH( kdf_alg );
        size_t hash_size = PSA_HASH_SIZE( hash_alg );
        if( hash_size == 0 )
            return( PSA_ERROR_NOT_SUPPORTED );
        if( ( PSA_ALG_IS_TLS12_PRF( kdf_alg ) ||
              PSA_ALG_IS_TLS12_PSK_TO_MS( kdf_alg ) ) &&
            ! ( hash_alg == PSA_ALG_SHA_256 || hash_alg == PSA_ALG_SHA_384 ) )
        {
            return( PSA_ERROR_NOT_SUPPORTED );
        }
        operation->capacity = 255 * hash_size;
        return( PSA_SUCCESS );
    }
#endif /* MBEDTLS_MD_C */
    else
        return( PSA_ERROR_NOT_SUPPORTED );
}